

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Scope __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::TranslateMemoryScope
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  byte bVar1;
  Scope SVar2;
  Capability local_4;
  
  if (((ulong)coherentFlags & 0x81) == 0) {
    if (((ulong)coherentFlags & 2) == 0) {
      if (((ulong)coherentFlags & 4) != 0) {
        return QueueFamily;
      }
      if (((ulong)coherentFlags & 8) != 0) {
        return ScopeWorkgroup;
      }
      if (((ulong)coherentFlags & 0x10) != 0) {
        return ScopeSubgroup;
      }
      if (((ulong)coherentFlags & 0x20) != 0) {
        return ScopeShaderCallKHR;
      }
      return Max;
    }
    bVar1 = this->glslangIntermediate->useVulkanMemoryModel;
    SVar2 = Device;
  }
  else {
    bVar1 = this->glslangIntermediate->useVulkanMemoryModel;
    SVar2 = (uint)bVar1 * 4 + Device;
  }
  if ((SVar2 == Device) && ((bVar1 & 1) != 0)) {
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&local_4);
    return Device;
  }
  return SVar2;
}

Assistant:

spv::Scope TGlslangToSpvTraverser::TranslateMemoryScope(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::Scope scope = spv::ScopeMax;

    if (coherentFlags.volatil || coherentFlags.coherent) {
        // coherent defaults to Device scope in the old model, QueueFamilyKHR scope in the new model
        scope = glslangIntermediate->usingVulkanMemoryModel() ? spv::ScopeQueueFamilyKHR : spv::ScopeDevice;
    } else if (coherentFlags.devicecoherent) {
        scope = spv::ScopeDevice;
    } else if (coherentFlags.queuefamilycoherent) {
        scope = spv::ScopeQueueFamilyKHR;
    } else if (coherentFlags.workgroupcoherent) {
        scope = spv::ScopeWorkgroup;
    } else if (coherentFlags.subgroupcoherent) {
        scope = spv::ScopeSubgroup;
    } else if (coherentFlags.shadercallcoherent) {
        scope = spv::ScopeShaderCallKHR;
    }
    if (glslangIntermediate->usingVulkanMemoryModel() && scope == spv::ScopeDevice) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelDeviceScopeKHR);
    }

    return scope;
}